

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupWithAttributes(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  char *__s;
  Gia_Man_t *p_00;
  Tim_Man_t *pTVar3;
  Gia_Man_t *pGVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  char *__dest;
  size_t sVar7;
  
  p_00 = Gia_ManDup(p);
  Gia_ManTransferMapping(p_00,p);
  Gia_ManTransferPacking(p_00,p);
  if ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) {
    pTVar3 = Tim_ManDup((Tim_Man_t *)p->pManTime,0);
    p_00->pManTime = pTVar3;
  }
  if (p->pAigExtra != (Gia_Man_t *)0x0) {
    pGVar4 = Gia_ManDup(p->pAigExtra);
    p_00->pAigExtra = pGVar4;
  }
  if (p->nAnd2Delay != 0) {
    p_00->nAnd2Delay = p->nAnd2Delay;
  }
  pVVar2 = p->vRegClasses;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    iVar1 = pVVar2->nSize;
    pVVar5->nSize = iVar1;
    pVVar5->nCap = iVar1;
    if ((long)iVar1 == 0) {
      sVar7 = 0;
      piVar6 = (int *)0x0;
    }
    else {
      sVar7 = (long)iVar1 << 2;
      piVar6 = (int *)malloc(sVar7);
    }
    pVVar5->pArray = piVar6;
    memcpy(piVar6,pVVar2->pArray,sVar7);
    p_00->vRegClasses = pVVar5;
  }
  pVVar2 = p->vRegInits;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    iVar1 = pVVar2->nSize;
    pVVar5->nSize = iVar1;
    pVVar5->nCap = iVar1;
    if ((long)iVar1 == 0) {
      sVar7 = 0;
      piVar6 = (int *)0x0;
    }
    else {
      sVar7 = (long)iVar1 << 2;
      piVar6 = (int *)malloc(sVar7);
    }
    pVVar5->pArray = piVar6;
    memcpy(piVar6,pVVar2->pArray,sVar7);
    p_00->vRegInits = pVVar5;
  }
  pVVar2 = p->vConfigs;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    iVar1 = pVVar2->nSize;
    pVVar5->nSize = iVar1;
    pVVar5->nCap = iVar1;
    if ((long)iVar1 == 0) {
      sVar7 = 0;
      piVar6 = (int *)0x0;
    }
    else {
      sVar7 = (long)iVar1 << 2;
      piVar6 = (int *)malloc(sVar7);
    }
    pVVar5->pArray = piVar6;
    memcpy(piVar6,pVVar2->pArray,sVar7);
    p_00->vConfigs = pVVar5;
  }
  __s = p->pCellStr;
  if (__s != (char *)0x0) {
    sVar7 = strlen(__s);
    __dest = (char *)malloc(sVar7 + 1);
    strcpy(__dest,__s);
    p_00->pCellStr = __dest;
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupWithAttributes( Gia_Man_t * p )
{
    Gia_Man_t * pNew = Gia_ManDup(p);
    Gia_ManTransferMapping( pNew, p );
    Gia_ManTransferPacking( pNew, p );
    if ( p->pManTime )
        pNew->pManTime = Tim_ManDup( (Tim_Man_t *)p->pManTime, 0 );
    if ( p->pAigExtra )
        pNew->pAigExtra = Gia_ManDup( p->pAigExtra );
    if ( p->nAnd2Delay )
        pNew->nAnd2Delay = p->nAnd2Delay;
    if ( p->vRegClasses )
        pNew->vRegClasses = Vec_IntDup( p->vRegClasses );
    if ( p->vRegInits )
        pNew->vRegInits = Vec_IntDup( p->vRegInits );
    if ( p->vConfigs )
        pNew->vConfigs = Vec_IntDup( p->vConfigs );
    if ( p->pCellStr )
        pNew->pCellStr = Abc_UtilStrsav( p->pCellStr );
    return pNew;
}